

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

void exesaveit(voccxdef *ctx,vocoldef *dolist)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  vocoldef *in_RSI;
  long in_RDI;
  runcxdef *rcx;
  int dbg;
  int i;
  int cnt;
  prpnum in_stack_00000170;
  objnum in_stack_00000172;
  prpnum in_stack_00000174;
  objnum in_stack_00000176;
  uchar **in_stack_00000178;
  runcxdef *in_stack_00000180;
  int in_stack_00000190;
  int in_stack_00000198;
  objnum in_stack_000001a0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  int local_18;
  
  bVar1 = *(byte *)(in_RDI + 0x119a);
  lVar2 = *(long *)(in_RDI + 0x10);
  iVar3 = voclistlen(in_RSI);
  if (iVar3 == 1) {
    if ((in_RSI->vocolflg != 0x400) && (in_RSI->vocolflg != 0x10)) {
      *(objnum *)(in_RDI + 0xf48) = in_RSI->vocolobj;
      *(undefined2 *)(in_RDI + 0xf4e) = 0;
      if ((bVar1 & 4) != 0) {
        outformat((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        uVar4 = 0;
        runpprop(in_stack_00000180,in_stack_00000178,in_stack_00000176,in_stack_00000174,
                 in_stack_00000172,in_stack_00000170,in_stack_00000190,in_stack_00000198,
                 in_stack_000001a0);
        outformat((char *)CONCAT44(in_stack_ffffffffffffffc4,uVar4));
      }
      uVar4 = 0;
      runpprop(in_stack_00000180,in_stack_00000178,in_stack_00000176,in_stack_00000174,
               in_stack_00000172,in_stack_00000170,in_stack_00000190,in_stack_00000198,
               in_stack_000001a0);
      if ((*(char *)(*(long *)(lVar2 + 0x20) + -0x10) == '\b') &&
         (*(undefined2 *)(in_RDI + 0xf4a) = *(undefined2 *)(in_RDI + 0xf48), (bVar1 & 4) != 0)) {
        outformat((char *)CONCAT44(in_stack_ffffffffffffffc4,uVar4));
      }
      *(long *)(lVar2 + 0x20) = *(long *)(lVar2 + 0x20) + -0x10;
      uVar4 = 0;
      runpprop(in_stack_00000180,in_stack_00000178,in_stack_00000176,in_stack_00000174,
               in_stack_00000172,in_stack_00000170,in_stack_00000190,in_stack_00000198,
               in_stack_000001a0);
      if ((*(char *)(*(long *)(lVar2 + 0x20) + -0x10) == '\b') &&
         (*(undefined2 *)(in_RDI + 0xf4c) = *(undefined2 *)(in_RDI + 0xf48), (bVar1 & 4) != 0)) {
        outformat((char *)CONCAT44(in_stack_ffffffffffffffc4,uVar4));
      }
      *(long *)(lVar2 + 0x20) = *(long *)(lVar2 + 0x20) + -0x10;
    }
  }
  else if (1 < iVar3) {
    *(short *)(in_RDI + 0xf4e) = (short)iVar3;
    *(undefined2 *)(in_RDI + 0xf48) = 0xffff;
    if ((bVar1 & 4) != 0) {
      outformat((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    for (local_18 = 0; local_18 < iVar3; local_18 = local_18 + 1) {
      *(objnum *)(in_RDI + 0xf50 + (long)local_18 * 2) = in_RSI[local_18].vocolobj;
      if ((bVar1 & 4) != 0) {
        uVar4 = 0;
        runpprop(in_stack_00000180,in_stack_00000178,in_stack_00000176,in_stack_00000174,
                 in_stack_00000172,in_stack_00000170,in_stack_00000190,in_stack_00000198,
                 in_stack_000001a0);
        outformat((char *)CONCAT44(in_stack_ffffffffffffffc4,uVar4));
      }
    }
  }
  return;
}

Assistant:

static void exesaveit(voccxdef *ctx, vocoldef *dolist)
{
    int       cnt;
    int       i;
    int       dbg = ctx->voccxflg & VOCCXFDBG;
    runcxdef *rcx = ctx->voccxrun;

    cnt = voclistlen(dolist);
    if (cnt == 1)
    {
        /*
         *   check to make sure they're not referring to a number or a
         *   string; if so, it doesn't make any sense to save it 
         */
        if (dolist[0].vocolflg == VOCS_STR
            || dolist[0].vocolflg == VOCS_NUM)
        {
            /* 
             *   As of 2.5.11, don't clear 'it' on a number or string;
             *   rather, just leave it as it was from the prior command.
             *   Players will almost never expect a number or string to have
             *   anything to do with pronoun antecedents, and in fact some
             *   players reported finding it confusing to have the antecedant
             *   implied by the second-most-recent command disappear when the
             *   most recent command used a number of string.  
             */
#if 0
            /* save a nil 'it' */
            ctx->voccxit = MCMONINV;
            if (dbg)
                tioputs(ctx->voccxtio,
                        ".. setting 'it' to nil (strObj/numObj)\\n");
#endif

            /* we're done */
            return;
        }

        /* save 'it' */
        ctx->voccxit = dolist[0].vocolobj;
        ctx->voccxthc = 0;

        if (dbg)
        {
            tioputs(ctx->voccxtio, ".. setting it: ");
            runppr(rcx, ctx->voccxit, PRP_SDESC, 0);
            tioputs(ctx->voccxtio, "\\n");
        }

        /* set "him" if appropriate */
        runppr(rcx, ctx->voccxit, PRP_ISHIM, 0);
        if (runtostyp(rcx) == DAT_TRUE)
        {
            ctx->voccxhim = ctx->voccxit;
            if (dbg)
                tioputs(ctx->voccxtio,
                        "... [setting \"him\" to same object]\\n");
        }
        rundisc(rcx);

        /* set "her" if appropriate */
        runppr(rcx, ctx->voccxit, PRP_ISHER, 0);
        if (runtostyp(rcx) == DAT_TRUE)
        {
            ctx->voccxher = ctx->voccxit;
            if (dbg)
                tioputs(ctx->voccxtio,
                        "... [setting \"her\" to same object]\\n");
        }
        rundisc(rcx);
    }
    else if (cnt > 1)
    {
        ctx->voccxthc = cnt;
        ctx->voccxit  = MCMONINV;
        if (dbg) tioputs(ctx->voccxtio, ".. setting \"them\": [");
        for (i = 0 ; i < cnt ; ++i)
        {
            ctx->voccxthm[i] = dolist[i].vocolobj;
            if (dbg)
            {
                runppr(rcx, dolist[i].vocolobj, PRP_SDESC, 0);
                tioputs(ctx->voccxtio, i+1 < cnt ? ", " : "]\\n");
            }
        }
    }
}